

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O1

int __thiscall let::Acceptor::listen(Acceptor *this,int __fd,int __n)

{
  bool bVar1;
  undefined7 extraout_var;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_28._8_8_ = 0;
  pcStack_10 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/chenyahui[P]let/let/acceptor.cpp:57:20)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/chenyahui[P]let/let/acceptor.cpp:57:20)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  EventLoop::execute(this->loop_,(Task *)&local_28,true);
  if (local_18 != (code *)0x0) {
    bVar1 = (*local_18)(&local_28,&local_28,__destroy_functor);
    local_18 = (code *)CONCAT71(extraout_var,bVar1);
  }
  return (int)local_18;
}

Assistant:

void Acceptor::listen()
{
    loop_->execute([=]() {
        evconnlistener_enable(ev_listener_);
        LOG_VERBOSE << "start listen ";
    });
}